

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O2

index_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::claimCapacity
          (ManyToOneRingBuffer *this,index_t requiredCapacity)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar8;
  
  uVar9 = (long)this->m_capacity - 1;
  uVar10 = *(undefined8 *)(this->m_buffer->m_buffer + this->m_headCachePositionIndex);
  do {
    lVar2 = *(long *)(this->m_buffer->m_buffer + this->m_tailPositionIndex);
    iVar6 = this->m_capacity;
    iVar4 = (int)lVar2;
    if (((int)uVar10 - iVar4) + iVar6 < requiredCapacity) {
      uVar10 = *(undefined8 *)(this->m_buffer->m_buffer + this->m_headPositionIndex);
      if (requiredCapacity <= ((int)uVar10 - iVar4) + this->m_capacity) {
        *(undefined8 *)(this->m_buffer->m_buffer + this->m_headCachePositionIndex) = uVar10;
        iVar6 = this->m_capacity;
        goto LAB_0015d970;
      }
LAB_0015d9f8:
      uVar5 = 0xfffffffe;
      goto LAB_0015d9fb;
    }
LAB_0015d970:
    uVar5 = (long)iVar4 & uVar9;
    uVar7 = iVar6 - (int)uVar5;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < requiredCapacity) {
      uVar7 = (uint)uVar9;
      if ((int)(uVar7 & (uint)uVar10) < requiredCapacity) {
        uVar10 = *(undefined8 *)(this->m_buffer->m_buffer + this->m_headPositionIndex);
        if ((int)(uVar7 & (uint)uVar10) < requiredCapacity) goto LAB_0015d9f8;
        *(undefined8 *)(this->m_buffer->m_buffer + this->m_headCachePositionIndex) = uVar10;
      }
    }
    else {
      uVar8 = 0;
    }
    plVar1 = (long *)(this->m_buffer->m_buffer + this->m_tailPositionIndex);
    LOCK();
    lVar3 = *plVar1;
    if (lVar2 == lVar3) {
      *plVar1 = (int)uVar8 + lVar2 + (long)requiredCapacity;
      lVar3 = lVar2;
    }
    UNLOCK();
  } while (lVar3 != lVar2);
  if ((int)uVar8 != 0) {
    *(ulong *)(this->m_buffer->m_buffer + uVar5) = uVar8 | 0xffffffff00000000;
    uVar5 = 0;
  }
LAB_0015d9fb:
  return (index_t)uVar5;
}

Assistant:

util::index_t claimCapacity(util::index_t requiredCapacity)
    {
        const util::index_t mask = m_capacity - 1;
        std::int64_t head = m_buffer.getInt64Volatile(m_headCachePositionIndex);

        std::int64_t tail;
        util::index_t tailIndex;
        util::index_t padding;
        do
        {
            tail = m_buffer.getInt64Volatile(m_tailPositionIndex);
            const util::index_t availableCapacity = m_capacity - static_cast<util::index_t>(tail - head);

            if (requiredCapacity > availableCapacity)
            {
                head = m_buffer.getInt64Volatile(m_headPositionIndex);

                if (requiredCapacity > (m_capacity - static_cast<util::index_t>(tail - head)))
                {
                    return INSUFFICIENT_CAPACITY;
                }

                m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
            }

            padding = 0;
            tailIndex = static_cast<util::index_t>(tail & mask);
            const util::index_t toBufferEndLength = m_capacity - tailIndex;

            if (requiredCapacity > toBufferEndLength)
            {
                std::int32_t headIndex = static_cast<std::int32_t>(head & mask);

                if (requiredCapacity > headIndex)
                {
                    head = m_buffer.getInt64Volatile(m_headPositionIndex);
                    headIndex = static_cast<std::int32_t>(head & mask);

                    if (requiredCapacity > headIndex)
                    {
                        return INSUFFICIENT_CAPACITY;
                    }

                    m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
                }

                padding = toBufferEndLength;
            }
        }
        while (!m_buffer.compareAndSetInt64(m_tailPositionIndex, tail, tail + requiredCapacity + padding));

        if (0 != padding)
        {
            m_buffer.putInt64Ordered(
                tailIndex, RecordDescriptor::makeHeader(padding, RecordDescriptor::PADDING_MSG_TYPE_ID));
            tailIndex = 0;
        }

        return tailIndex;
    }